

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O2

void __thiscall
QPlainTestLogger::printBenchmarkResults(QPlainTestLogger *this,QList<QBenchmarkResult> *results)

{
  array<char,_1024UL> *msg;
  double dVar1;
  int iVar2;
  double *pdVar3;
  char *pcVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined1 *puVar7;
  QBenchmarkResult *pQVar8;
  int iVar9;
  char *pcVar10;
  QBenchmarkResult *pQVar11;
  long in_FS_OFFSET;
  qreal value;
  double dVar12;
  optional<double> oVar13;
  double local_488;
  anon_class_8_1_c4c56ed6 local_470;
  _Storage<double,_true> local_468;
  undefined8 *local_460;
  _Storage<double,_true> local_450;
  undefined1 *local_448;
  FixedBufString<1022> local_440;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  msg = &local_440.buf;
  memset(msg,0xaa,0x400);
  local_460 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
  local_470.results = results;
  oVar13 = printBenchmarkResults::anon_class_8_1_c4c56ed6::operator()
                     (&local_470,WalltimeNanoseconds);
  local_468 = oVar13.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_payload;
  local_460 = (undefined8 *)
              CONCAT71(local_460._1_7_,
                       oVar13.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_engaged);
  if (((undefined1  [16])
       oVar13.super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_448 = &DAT_aaaaaaaaaaaaaaaa;
    oVar13 = printBenchmarkResults::anon_class_8_1_c4c56ed6::operator()
                       (&local_470,WalltimeMilliseconds);
    local_450 = oVar13.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_payload;
    local_448 = (undefined1 *)
                CONCAT71(local_448._1_7_,
                         oVar13.super__Optional_base<double,_true,_true>._M_payload.
                         super__Optional_payload_base<double>._M_engaged);
    local_488 = 0.0;
    if (((undefined1  [16])
         oVar13.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pdVar3 = std::_Optional_base_impl<double,_std::_Optional_base<double,_true,_true>_>::_M_get
                         ((_Optional_base_impl<double,_std::_Optional_base<double,_true,_true>_> *)
                          &local_450);
      local_488 = *pdVar3 / 1000.0;
    }
  }
  else {
    pdVar3 = std::_Optional_base_impl<double,_std::_Optional_base<double,_true,_true>_>::_M_get
                       ((_Optional_base_impl<double,_std::_Optional_base<double,_true,_true>_> *)
                        &local_468);
    local_488 = *pdVar3 / 1000000000.0;
  }
  pQVar11 = (results->d).ptr;
  pQVar8 = pQVar11 + (results->d).size;
  do {
    if (pQVar11 == pQVar8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    local_440.used = 0;
    local_440.buf._M_elems[0] = '\0';
    pcVar4 = QTest::benchmarkMetricUnit((pQVar11->measurement).metric);
    dVar1 = (pQVar11->measurement).value;
    iVar9 = 0;
    if (0.0 < dVar1) {
      iVar9 = 0;
      for (dVar12 = 1.0; 1.0 <= dVar1 / dVar12; dVar12 = dVar12 * 10.0) {
        iVar9 = iVar9 + 1;
      }
    }
    QTest::formatResult<double>((QByteArray *)&local_468,dVar1 / (double)pQVar11->iterations,iVar9);
    puVar6 = local_460;
    if (local_460 == (undefined8 *)0x0) {
      puVar6 = &QByteArray::_empty;
    }
    pcVar10 = "";
    if (pQVar11->setByMacro != false) {
      pcVar10 = " per iteration";
    }
    iVar2 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,"     %s %s%s",puVar6,
                     pcVar4,pcVar10);
    local_440.used = local_440.used + (long)iVar2;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_468);
    switch((pQVar11->measurement).metric) {
    case BitsPerSecond:
      value = (pQVar11->measurement).value;
      pcVar4 = "bit/s";
LAB_0011de6c:
      anon_unknown.dwarf_9fc87::FixedBufString<1022>::appendScaled<1000>(&local_440,value,pcVar4);
      break;
    case BytesPerSecond:
      dVar1 = (pQVar11->measurement).value;
      puVar7 = &(anonymous_namespace)::multiplePrefixes;
      for (lVar5 = 1; (double)(lVar5 * 1000) < dVar1; lVar5 = lVar5 << 10) {
        puVar7 = puVar7 + 1;
      }
      local_468 = (_Storage<double,_true>)(CONCAT71(local_468._1_7_,*puVar7) & 0xffffffffffff00ff);
      (anonymous_namespace)::FixedBufString<1022>::appendf<double,char*,char_const*>
                ((FixedBufString<1022> *)&local_440,(char *)&local_468,dVar1 / (double)lVar5,"B/s",
                 (char *)CONCAT71((int7)((ulong)puVar7 >> 8),*puVar7));
      break;
    case InstructionReads:
    case Events:
    case BytesAllocated:
    case CPUMigrations:
    case BusCycles:
    case StalledCycles:
    case BranchInstructions:
    case BranchMisses:
    case CacheReferences:
    case CacheReads:
    case CacheWrites:
    case CachePrefetches:
    case CacheMisses:
    case CacheReadMisses:
    case CacheWriteMisses:
    case CachePrefetchMisses:
    case ContextSwitches:
    case PageFaults:
    case MinorPageFaults:
    case MajorPageFaults:
    case AlignmentFaults:
    case EmulationFaults:
switchD_0011de41_caseD_5:
      if ((local_488 != 0.0) || (NAN(local_488))) {
        value = (pQVar11->measurement).value / local_488;
        pcVar4 = "/sec";
        goto LAB_0011de6c;
      }
      break;
    case CPUCycles:
    case RefCPUCycles:
      if ((local_488 != 0.0) || (NAN(local_488))) {
        value = (pQVar11->measurement).value / local_488;
        pcVar4 = "Hz";
        goto LAB_0011de6c;
      }
      break;
    case Instructions:
      local_468._M_value = -NAN;
      local_460 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
      oVar13 = printBenchmarkResults::anon_class_8_1_c4c56ed6::operator()(&local_470,CPUCycles);
      local_468 = oVar13.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      local_460 = (undefined8 *)
                  CONCAT71(local_460._1_7_,
                           oVar13.super__Optional_base<double,_true,_true>._M_payload.
                           super__Optional_payload_base<double>._M_engaged);
      if (((undefined1  [16])
           oVar13.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto switchD_0011de41_caseD_5;
      dVar1 = (pQVar11->measurement).value;
      pdVar3 = std::_Optional_base_impl<double,_std::_Optional_base<double,_true,_true>_>::_M_get
                         ((_Optional_base_impl<double,_std::_Optional_base<double,_true,_true>_> *)
                          &local_468);
      iVar2 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,", %.3f instr/cycle",
                       dVar1 / *pdVar3);
      local_440.used = local_440.used + (long)iVar2;
    }
    QTest::formatResult<double>((QByteArray *)&local_468,(pQVar11->measurement).value,iVar9);
    puVar6 = local_460;
    if (local_460 == (undefined8 *)0x0) {
      puVar6 = &QByteArray::_empty;
    }
    iVar9 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,
                     " (total: %s, iterations: %d)\n",puVar6,(ulong)(uint)pQVar11->iterations);
    local_440.used = local_440.used + (long)iVar9;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_468);
    QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,msg->_M_elems);
    pQVar11 = pQVar11 + 1;
  } while( true );
}

Assistant:

void QPlainTestLogger::printBenchmarkResults(const QList<QBenchmarkResult> &results)
{
    using namespace std::chrono;
    FixedBufString<1022> buf;
    auto findResultFor = [&results](QTest::QBenchmarkMetric metric) -> std::optional<qreal> {
        for (const QBenchmarkResult &result : results) {
            if (result.measurement.metric == metric)
                return result.measurement.value;
        }
        return std::nullopt;
    };

    // we need the execution time quite often, so find it first
    qreal executionTime = 0;
    if (auto ns = findResultFor(QTest::WalltimeNanoseconds))
        executionTime = *ns / (1000 * 1000 * 1000);
    else if (auto ms = findResultFor(QTest::WalltimeMilliseconds))
        executionTime = *ms / 1000;

    for (const QBenchmarkResult &result : results) {
        buf.clear();

        const char * unitText = QTest::benchmarkMetricUnit(result.measurement.metric);
        int significantDigits = QTest::countSignificantDigits(result.measurement.value);
        qreal valuePerIteration = qreal(result.measurement.value) / qreal(result.iterations);
        buf.appendf("     %s %s%s", QTest::formatResult(valuePerIteration, significantDigits).constData(),
                    unitText, result.setByMacro ? " per iteration" : "");

        switch (result.measurement.metric) {
        case QTest::BitsPerSecond:
            // for bits/s, we'll use powers of 10 (1 Mbit/s = 1000 kbit/s = 1000000 bit/s)
            buf.appendScaled<1000>(result.measurement.value, "bit/s");
            break;
        case QTest::BytesPerSecond:
            // for B/s, we'll use powers of 2 (1 MB/s = 1024 kB/s = 1048576 B/s)
            buf.appendScaled<1024>(result.measurement.value, "B/s");
            break;

        case QTest::CPUCycles:
        case QTest::RefCPUCycles:
            if (!qIsNull(executionTime))
                buf.appendScaled(result.measurement.value / executionTime, "Hz");
            break;

        case QTest::Instructions:
            if (auto cycles = findResultFor(QTest::CPUCycles)) {
                buf.appendf(", %.3f instr/cycle", result.measurement.value / *cycles);
                break;
            }
            Q_FALLTHROUGH();

        case QTest::InstructionReads:
        case QTest::Events:
        case QTest::BytesAllocated:
        case QTest::CPUMigrations:
        case QTest::BusCycles:
        case QTest::StalledCycles:
        case QTest::BranchInstructions:
        case QTest::BranchMisses:
        case QTest::CacheReferences:
        case QTest::CacheReads:
        case QTest::CacheWrites:
        case QTest::CachePrefetches:
        case QTest::CacheMisses:
        case QTest::CacheReadMisses:
        case QTest::CacheWriteMisses:
        case QTest::CachePrefetchMisses:
        case QTest::ContextSwitches:
        case QTest::PageFaults:
        case QTest::MinorPageFaults:
        case QTest::MajorPageFaults:
        case QTest::AlignmentFaults:
        case QTest::EmulationFaults:
            if (!qIsNull(executionTime))
                buf.appendScaled(result.measurement.value / executionTime, "/sec");
            break;

        case QTest::FramesPerSecond:
        case QTest::CPUTicks:
        case QTest::WalltimeMilliseconds:
        case QTest::WalltimeNanoseconds:
            break;  // no additional information
        }

        Q_ASSERT(result.iterations > 0);
        buf.appendf(" (total: %s, iterations: %d)\n",
                    QTest::formatResult(result.measurement.value, significantDigits).constData(),
                    result.iterations);

        outputMessage(buf);
    }
}